

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteTypes(WatWriter *this,TypeVector *types,char *name)

{
  Type *pTVar1;
  Type *pTVar2;
  
  if ((types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    if (name != (char *)0x0) {
      WritePuts(this,"(",None);
      WritePuts(this,name,Space);
      this->indent_ = this->indent_ + 2;
    }
    pTVar1 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                  super__Vector_impl_data._M_start; pTVar2 != pTVar1; pTVar2 = pTVar2 + 1) {
      WriteType(this,*pTVar2,Space);
    }
    if (name != (char *)0x0) {
      WriteClose(this,Space);
      return;
    }
  }
  return;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnReturnCallIndirectExpr(
    ReturnCallIndirectExpr* expr) {
  writer_->WritePutsSpace(Opcode::ReturnCallIndirect_Opcode.GetName());
  writer_->WriteOpenSpace("type");
  const auto type_var =
      expr->decl.has_func_type
          ? expr->decl.type_var
          : Var{writer_->module.GetFuncTypeIndex(expr->decl), expr->loc};
  writer_->WriteVar(type_var, NextChar::Space);
  writer_->WriteCloseNewline();
  return Result::Ok;
}